

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

Vec4 __thiscall
deqp::gles3::Functional::getDerivateThreshold
          (Functional *this,Precision precision,Vec4 *valueMin,Vec4 *valueMax,Vec4 *expectedDerivate
          )

{
  int iVar1;
  float fVar7;
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  uint uVar8;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar9 [16];
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  Vec4 VVar27;
  undefined1 auVar5 [16];
  
  iVar1 = 0;
  if (precision < PRECISION_LAST) {
    iVar1 = *(int *)(&DAT_00b1ab08 + (ulong)precision * 4);
  }
  auVar2 = *(undefined1 (*) [16])expectedDerivate->m_data;
  uVar8 = auVar2._0_4_ >> 0x17 & 0xff;
  uVar10 = auVar2._4_4_ >> 0x17 & 0xff;
  uVar11 = auVar2._8_4_ >> 0x17 & 0xff;
  uVar12 = auVar2._12_4_ >> 0x17 & 0xff;
  uVar17 = (uint)valueMin->m_data[0] >> 0x17 & 0xff;
  uVar20 = (uint)valueMin->m_data[1] >> 0x17 & 0xff;
  uVar21 = (uint)valueMin->m_data[2] >> 0x17 & 0xff;
  uVar22 = (uint)valueMin->m_data[3] >> 0x17 & 0xff;
  uVar23 = (uint)valueMax->m_data[0] >> 0x17 & 0xff;
  uVar24 = (uint)valueMax->m_data[1] >> 0x17 & 0xff;
  uVar25 = (uint)valueMax->m_data[2] >> 0x17 & 0xff;
  uVar26 = (uint)valueMax->m_data[3] >> 0x17 & 0xff;
  uVar13 = -(uint)(uVar23 < uVar17);
  uVar14 = -(uint)(uVar24 < uVar20);
  uVar15 = -(uint)(uVar25 < uVar21);
  uVar16 = -(uint)(uVar26 < uVar22);
  uVar13 = ~uVar13 & uVar23 | uVar17 & uVar13;
  uVar14 = ~uVar14 & uVar24 | uVar20 & uVar14;
  uVar15 = ~uVar15 & uVar25 | uVar21 & uVar15;
  uVar16 = ~uVar16 & uVar26 | uVar22 & uVar16;
  uVar8 = (iVar1 - (-(uint)(uVar8 < uVar13) & uVar13 - uVar8)) - 3;
  uVar10 = (iVar1 - (-(uint)(uVar10 < uVar14) & uVar14 - uVar10)) - 3;
  uVar11 = (iVar1 - (-(uint)(uVar11 < uVar15) & uVar15 - uVar11)) - 3;
  uVar12 = (iVar1 - (-(uint)(uVar12 < uVar16) & uVar16 - uVar12)) - 3;
  auVar9._0_4_ = (int)(float)((0x17 - (-(uint)(0 < (int)uVar8) & uVar8)) * 0x800000 + 0x3f800000);
  auVar9._4_4_ = (int)(float)((0x17 - (-(uint)(0 < (int)uVar10) & uVar10)) * 0x800000 + 0x3f800000);
  auVar9._8_4_ = (int)(float)((0x17 - (-(uint)(0 < (int)uVar11) & uVar11)) * 0x800000 + 0x3f800000);
  auVar9._12_4_ = (int)(float)((0x17 - (-(uint)(0 < (int)uVar12) & uVar12)) * 0x800000 + 0x3f800000)
  ;
  auVar18._4_4_ = auVar9._4_4_;
  auVar18._0_4_ = auVar9._4_4_;
  auVar18._8_4_ = auVar9._12_4_;
  auVar18._12_4_ = auVar9._12_4_;
  auVar4._0_4_ = -auVar9._0_4_;
  auVar5._8_4_ = (undefined4)((auVar9._8_8_ & 0xffffffff) * 0xffffffff);
  auVar5._4_4_ = auVar5._8_4_;
  auVar5._0_4_ = auVar4._0_4_;
  auVar5._12_4_ = (int)((auVar18._8_8_ & 0xffffffff) * 0xffffffff);
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._4_4_ = -auVar9._4_4_;
  auVar9 = _DAT_00b1a920 & auVar2;
  auVar19._0_4_ = -(uint)(auVar9._0_4_ == 0);
  auVar19._4_4_ = -(uint)(auVar9._4_4_ == 0);
  auVar19._8_4_ = -(uint)(auVar9._8_4_ == 0);
  auVar19._12_4_ = -(uint)(auVar9._12_4_ == 0);
  auVar2 = auVar2 & _DAT_00b1a930;
  auVar6._0_4_ = -(uint)(0 < auVar2._0_4_);
  auVar6._4_4_ = -(uint)(0 < auVar2._4_4_);
  auVar6._8_4_ = -(uint)(0 < auVar2._8_4_);
  auVar6._12_4_ = -(uint)(0 < auVar2._12_4_);
  auVar2 = auVar6 & auVar19 & _DAT_00b1a940 | ~(auVar6 & auVar19) & auVar9;
  auVar6 = (auVar4 & _DAT_00b1a930 | auVar2) ^ _DAT_00b1a930;
  fVar3 = auVar6._0_4_ - auVar2._0_4_;
  fVar7 = auVar6._4_4_ - auVar2._4_4_;
  *(undefined1 (*) [16])this =
       CONCAT412(auVar6._12_4_ - auVar2._12_4_,
                 CONCAT48(auVar6._8_4_ - auVar2._8_4_,CONCAT44(fVar7,fVar3)));
  VVar27.m_data._0_8_ = auVar2._0_8_;
  VVar27.m_data[2] = fVar3;
  VVar27.m_data[3] = fVar7;
  return (Vec4)VVar27.m_data;
}

Assistant:

static inline tcu::Vec4 getDerivateThreshold (const glu::Precision precision, const tcu::Vec4& valueMin, const tcu::Vec4& valueMax, const tcu::Vec4& expectedDerivate)
{
	const int			baseBits		= getNumMantissaBits(precision);
	const tcu::UVec4	derivExp		= getCompExpBits(expectedDerivate);
	const tcu::UVec4	maxValueExp		= max(getCompExpBits(valueMin), getCompExpBits(valueMax));
	const tcu::UVec4	numBitsLost		= maxValueExp - min(maxValueExp, derivExp);
	const tcu::IVec4	numAccurateBits	= max(baseBits - numBitsLost.asInt() - (int)INTERPOLATION_LOST_BITS, tcu::IVec4(0));

	return tcu::Vec4(computeFloatingPointError(expectedDerivate[0], numAccurateBits[0]),
					 computeFloatingPointError(expectedDerivate[1], numAccurateBits[1]),
					 computeFloatingPointError(expectedDerivate[2], numAccurateBits[2]),
					 computeFloatingPointError(expectedDerivate[3], numAccurateBits[3]));
}